

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_GetFullscreen(void)

{
  GPU_Target *pGVar1;
  undefined8 uVar2;
  ulong uVar3;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pGVar1 = (GPU_Target *)0x0;
  }
  else {
    pGVar1 = _gpu_current_renderer->current_context_target;
  }
  if (pGVar1 != (GPU_Target *)0x0) {
    uVar2 = SDL_GetWindowFromID(pGVar1->context->windowID);
    uVar3 = SDL_GetWindowFlags(uVar2);
    return (uVar3 & 0x1001) != 0;
  }
  return false;
}

Assistant:

GPU_bool GPU_GetFullscreen(void)
{
#ifdef SDL_GPU_USE_SDL2
    GPU_Target* target = GPU_GetContextTarget();
    if(target == NULL)
        return GPU_FALSE;
    return (SDL_GetWindowFlags(SDL_GetWindowFromID(target->context->windowID))
                   & (SDL_WINDOW_FULLSCREEN | SDL_WINDOW_FULLSCREEN_DESKTOP)) != 0;
#else
    SDL_Surface* surf = SDL_GetVideoSurface();
    if(surf == NULL)
        return GPU_FALSE;
    return (surf->flags & SDL_FULLSCREEN) != 0;
#endif
}